

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_Tent_Test::TestBody(Sampling_Tent_Test *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *pfVar6;
  size_t sVar7;
  Allocator AVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  char *in_R9;
  bool bVar12;
  undefined1 auVar13 [16];
  Float FVar14;
  Float FVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  span<const_float> f;
  Float radius;
  AssertHelper local_170;
  AssertionResult gtest_ar_;
  undefined1 local_158 [16];
  Float dp;
  undefined1 local_138 [16];
  Float local_11c;
  AssertionResult gtest_ar_1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  AssertHelper local_c0;
  Float dist;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  RNG rng;
  AssertionResult gtest_ar;
  undefined1 extraout_var [60];
  
  FVar14 = pbrt::SampleTent(0.501,1.0);
  FVar15 = pbrt::SampleTent(0.499,1.0);
  values.alloc.memoryResource = (memory_resource *)0x3f847ae147ae147b;
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)(FVar14 - FVar15)),auVar13);
  dist = auVar13._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"dist",".01",&dist,(double *)&values);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&values);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x2c6,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&values);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 4) {
    local_b0._8_8_ = 0;
    FVar14 = *(Float *)((long)&DAT_00586a78 + lVar9);
    local_b0._M_unused._M_object = &radius;
    local_98 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:715:21)>
               ::_M_invoke;
    local_a0 = std::
               _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:715:21)>
               ::_M_manager;
    local_138._4_4_ = 0x80000000;
    local_138._0_4_ = -FVar14;
    local_138._8_4_ = 0x80000000;
    local_138._12_4_ = 0x80000000;
    radius = FVar14;
    AVar8.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&values,(function<float_(float)> *)&local_b0,0x2000,0x40,(Float)local_138._0_4_,
               FVar14,AVar8);
    std::_Function_base::~_Function_base((_Function_base *)&local_b0);
    sVar7 = values.nStored;
    pfVar6 = values.ptr;
    FVar14 = radius;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    local_138 = vxorps_avx512vl(ZEXT416((uint)radius),auVar1);
    AVar8.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar7;
    f.ptr = pfVar6;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              ((PiecewiseConstant1D *)&gtest_ar,f,(Float)local_138._0_4_,FVar14,AVar8);
    iVar10 = 100;
    while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
      local_138._0_4_ = pbrt::RNG::Uniform<float>(&rng);
      local_138._4_4_ = extraout_XMM0_Db;
      local_138._8_4_ = extraout_XMM0_Dc;
      local_138._12_4_ = extraout_XMM0_Dd;
      local_158._0_4_ = pbrt::SampleTent((Float)local_138._0_4_,radius);
      FVar14 = radius;
      local_158._4_4_ = extraout_XMM0_Db_00;
      local_158._8_4_ = extraout_XMM0_Dc_00;
      local_158._12_4_ = extraout_XMM0_Dd_00;
      local_11c = pbrt::PiecewiseConstant1D::Sample
                            ((PiecewiseConstant1D *)&gtest_ar,(Float)local_138._0_4_,&dp,(int *)0x0)
      ;
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f689374bc6a7e;
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx512vl(ZEXT416((uint)((float)local_158._0_4_ - local_11c)),auVar4);
      local_170.data_._0_4_ = auVar13._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar_1,"std::abs(tx - dx)","3e-3",(float *)&local_170,
                 (double *)&gtest_ar_);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),(float)local_158._0_4_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),local_11c);
        pcVar11 = "";
        if (gtest_ar_1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x2d6,pcVar11);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx(auVar16,local_158);
      uVar2 = vcmpss_avx512f(ZEXT416((uint)FVar14),auVar13,6);
      fVar3 = (float)((uint)((byte)uVar2 & 1) *
                     (int)(1.0 / FVar14 - auVar13._0_4_ / (FVar14 * FVar14)));
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f689374bc6a7e;
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx512vl(ZEXT416((uint)(fVar3 - dp)),auVar5);
      local_170.data_._0_4_ = auVar13._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar_1,"std::abs(tp - dp)","3e-3",(float *)&local_170,
                 (double *)&gtest_ar_);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),fVar3);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),dp);
        pcVar11 = "";
        if (gtest_ar_1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x2d8,pcVar11);
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      auVar17._0_4_ = pbrt::InvertTentSample((Float)local_158._0_4_,radius);
      auVar17._4_60_ = extraout_var;
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx(local_138,auVar18);
      auVar1 = vandps_avx(auVar17._0_16_,auVar18);
      auVar13 = vminss_avx(auVar1,auVar13);
      fVar3 = local_138._0_4_ - auVar17._0_4_;
      bVar12 = auVar13._0_4_ < 0.01;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auVar13 = vandps_avx(ZEXT416((uint)bVar12 * (int)fVar3 +
                                   (uint)!bVar12 *
                                   (int)((fVar3 + fVar3) / (local_138._0_4_ + auVar17._0_4_))),
                           auVar18);
      gtest_ar_.success_ = auVar13._0_4_ <= 0.01;
      if (0.01 < auVar13._0_4_) {
        testing::Message::Message((Message *)&local_170);
        std::operator<<((ostream *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),
                        "u ");
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),
                   (float)local_138._0_4_);
        std::operator<<((ostream *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),
                        " radius ");
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),radius);
        std::operator<<((ostream *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),
                        " x ");
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),
                   (float)local_158._0_4_);
        std::operator<<((ostream *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),
                        " inverse ");
        FVar14 = pbrt::InvertTentSample((Float)local_158._0_4_,radius);
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_170.data_._4_4_,local_170.data_._0_4_) + 0x10),FVar14);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
                   (AssertionResult *)"checkErr(u, InvertTentSample(tx, radius))","true","false",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x2e3,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        std::__cxx11::string::~string((string *)&gtest_ar_1);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_170);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D((PiecewiseConstant1D *)&gtest_ar);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&values);
  }
  return;
}

Assistant:

TEST(Sampling, Tent) {
    // Make sure stratification is preserved at the midpoint of the
    // sampling domain.
    Float dist = std::abs(SampleTent(.501, 1) - SampleTent(.499, 1));
    EXPECT_LT(dist, .01);

    Float rad[] = {Float(1), Float(2.5), Float(.125)};
    RNG rng;
    for (Float radius : rad) {
        auto tent = [&](Float x) { return std::max<Float>(0, 1 - std::abs(x) / radius); };

        auto values = Sample1DFunction(tent, 8192, 64, -radius, radius);
        PiecewiseConstant1D distrib(values, -radius, radius);
        for (int i = 0; i < 100; ++i) {
            Float u = rng.Uniform<Float>();
            Float tx = SampleTent(u, radius);
            Float tp = TentPDF(tx, radius);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(tx - dx), 3e-3)
                << "Closed form = " << tx << ", distrib = " << dx;
            EXPECT_LT(std::abs(tp - dp), 3e-3)
                << "Closed form PDF = " << tp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTentSample(tx, radius)))
                << "u " << u << " radius " << radius << " x " << tx << " inverse "
                << InvertTentSample(tx, radius);
        }
    }
}